

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLexicalAnalyzer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int code;
  basic_streambuf<char,_std::char_traits<char>_> *cinBuf;
  ifstream fin;
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  if (argc == 1) {
    argv_local._4_4_ = analyze();
  }
  else {
    for (local_1c = 1; local_1c < argc; local_1c = local_1c + 1) {
      std::ifstream::ifstream(&cinBuf,argv[local_1c],8);
      lVar1 = *(long *)(std::cin + -0x18);
      std::ifstream::rdbuf();
      std::ios::rdbuf((streambuf *)((long)&std::cin + lVar1));
      iVar3 = analyze();
      iVar2 = iVar3;
      if (iVar3 < 1) {
        std::ifstream::close();
        std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
        iVar2 = argv_local._4_4_;
      }
      argv_local._4_4_ = iVar2;
      std::ifstream::~ifstream(&cinBuf);
      if (iVar3 >= 1) {
        return argv_local._4_4_;
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc == 1)
        return analyze();
    else
        for (int i = 1; i < argc; i++)
        {
            std::ifstream fin(argv[i]);
            auto cinBuf = std::cin.rdbuf(fin.rdbuf());
            int code = analyze();
            if (code > 0)
                return code;
            fin.close();
            std::cin.rdbuf(cinBuf);
        }
}